

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

bool wasm::anon_unknown_24::isUninhabitable
               (HeapType type,
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               *visited,unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *visiting)

{
  bool bVar1;
  undefined4 uVar2;
  size_type sVar3;
  type *ptVar4;
  type_conflict *ptVar5;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this;
  reference pFVar6;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar7;
  Type local_98;
  Field *field;
  const_iterator __end3;
  const_iterator __begin3;
  FieldList *__range3;
  type_conflict *inserted;
  type *it;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> local_38;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *local_28;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *visiting_local;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *visited_local;
  HeapType type_local;
  
  local_28 = visiting;
  visiting_local = visited;
  visited_local =
       (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        *)type.id;
  uVar2 = wasm::HeapType::getKind();
  switch(uVar2) {
  case 0:
    return false;
  case 1:
  case 4:
    return false;
  case 2:
  case 3:
  }
  sVar3 = std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::count(visiting_local,(key_type *)&visited_local);
  if (sVar3 == 0) {
    pVar7 = std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::insert(local_28,(value_type *)&visited_local);
    local_38.first = pVar7.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
    local_38.second = pVar7.second;
    ptVar4 = std::get<0ul,std::__detail::_Node_iterator<wasm::HeapType,true,true>,bool>(&local_38);
    ptVar5 = std::get<1ul,std::__detail::_Node_iterator<wasm::HeapType,true,true>,bool>(&local_38);
    if ((*ptVar5 & 1U) == 0) {
      type_local.id._7_1_ = true;
    }
    else {
      uVar2 = wasm::HeapType::getKind();
      switch(uVar2) {
      case 0:
      case 1:
      case 4:
        wasm::handle_unreachable
                  ("unexpected kind",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x42d);
      case 2:
        this = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct();
        __end3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(this);
        field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                                           *)&field), bVar1) {
          pFVar6 = __gnu_cxx::
                   __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                   ::operator*(&__end3);
          bVar1 = isUninhabitable((Type)(pFVar6->type).id,visiting_local,local_28);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
          ::operator++(&__end3);
        }
        break;
      case 3:
        wasm::HeapType::getArray();
        bVar1 = isUninhabitable(local_98,visiting_local,local_28);
        if (bVar1) {
          return true;
        }
      }
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::erase(local_28,(iterator)(ptVar4->super__Node_iterator_base<wasm::HeapType,_true>)._M_cur);
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::insert(visiting_local,(value_type *)&visited_local);
      type_local.id._7_1_ = false;
    }
  }
  else {
    type_local.id._7_1_ = false;
  }
  return type_local.id._7_1_;
}

Assistant:

bool isUninhabitable(HeapType type,
                     std::unordered_set<HeapType>& visited,
                     std::unordered_set<HeapType>& visiting) {
  switch (type.getKind()) {
    case HeapTypeKind::Basic:
      return false;
    case HeapTypeKind::Func:
    case HeapTypeKind::Cont:
      // Function types are always inhabitable.
      return false;
    case HeapTypeKind::Struct:
    case HeapTypeKind::Array:
      break;
  }
  if (visited.count(type)) {
    return false;
  }
  auto [it, inserted] = visiting.insert(type);
  if (!inserted) {
    return true;
  }
  switch (type.getKind()) {
    case HeapTypeKind::Struct:
      for (auto& field : type.getStruct().fields) {
        if (isUninhabitable(field.type, visited, visiting)) {
          return true;
        }
      }
      break;
    case HeapTypeKind::Array:
      if (isUninhabitable(type.getArray().element.type, visited, visiting)) {
        return true;
      }
      break;
    case HeapTypeKind::Basic:
    case HeapTypeKind::Func:
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("unexpected kind");
  }
  visiting.erase(it);
  visited.insert(type);
  return false;
}